

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int __fd;
  ulong uVar1;
  char *__s;
  iovec buffers [3];
  iovec local_48;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  
  __fd = open(file_name,0x242,0x1b6);
  if (__fd == -1) {
    __s = "open returned (-1)";
  }
  else {
    local_48.iov_base = file_data1;
    local_48.iov_len = strlen(file_data1);
    local_38 = file_data2;
    local_30 = strlen(file_data2);
    local_28 = file_data3;
    local_20 = strlen(file_data3);
    uVar1 = writev(__fd,&local_48,3);
    if ((int)uVar1 != -1) {
      printf("wrote %d bytes\n",uVar1 & 0xffffffff);
      close(__fd);
      return 0;
    }
    __s = "writev returned (-1)";
  }
  puts(__s);
  return -1;
}

Assistant:

int main(int argc, char* argv[])
{

    int fd = open(file_name, O_CREAT | O_TRUNC | O_RDWR, 0666);
    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    struct iovec buffers[3];
    buffers[0].iov_base = file_data1;
    buffers[0].iov_len = strlen(file_data1);
    buffers[1].iov_base = file_data2;
    buffers[1].iov_len = strlen(file_data2);
    buffers[2].iov_base = file_data3;
    buffers[2].iov_len = strlen(file_data3);

    int written = writev(fd, buffers, 3);
    if(written == (-1))
    {
        printf("writev returned (-1)\n");
        return (-1);
    }
    printf("wrote %d bytes\n", written);

    close(fd);
    return 0;
}